

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::ImportClient::~ImportClient(ImportClient *this)

{
  anon_class_8_1_8991fb9c local_18;
  
  local_18.this = this;
  kj::UnwindDetector::
  catchExceptionsIfUnwinding<capnp::_::RpcSystemBase::RpcConnectionState::ImportClient::~ImportClient()::_lambda()_1_>
            (&this->unwindDetector,&local_18);
  if ((this->fd).ptr.isSet == true) {
    kj::OwnFd::~OwnFd(&(this->fd).ptr.field_1.value);
  }
  RpcClient::~RpcClient(&this->super_RpcClient);
  return;
}

Assistant:

~ImportClient() noexcept(false) {
      unwindDetector.catchExceptionsIfUnwinding([&]() {
        // Remove self from the import table, if the table is still pointing at us.
        KJ_IF_SOME(import, connectionState->imports.find(importId)) {
          KJ_IF_SOME(i, import.importClient) {
            if (&i == this) {
              connectionState->imports.erase(importId);
            }
          }
        }

        // Send a message releasing our remote references.
        if (remoteRefcount > 0 && connectionState->connection.is<Connected>()) {
          auto message = connectionState->connection.get<Connected>().connection
              ->newOutgoingMessage(messageSizeHint<rpc::Release>());
          rpc::Release::Builder builder = message->getBody().initAs<rpc::Message>().initRelease();
          builder.setId(importId);
          builder.setReferenceCount(remoteRefcount);
          message->send();
        }

        connectionState->checkIfBecameIdle();
      });
    }